

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz_encoder_mf.c
# Opt level: O1

void lzma_mf_bt2_skip(lzma_mf *mf,uint32_t amount)

{
  ushort uVar1;
  uint uVar2;
  uint32_t cur_match;
  uint8_t *puVar3;
  uint uVar4;
  uint32_t pos;
  uint len_limit;
  
  do {
    uVar2 = mf->read_pos;
    uVar4 = mf->write_pos - uVar2;
    len_limit = mf->nice_len;
    if ((uVar4 < mf->nice_len) &&
       ((uVar4 < 2 || (len_limit = uVar4, mf->action == LZMA_SYNC_FLUSH)))) {
      if (mf->action == LZMA_RUN) {
        __assert_fail("mf->action != LZMA_RUN",
                      "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmliblzma/liblzma/lz/lz_encoder_mf.c"
                      ,0x28f,"void lzma_mf_bt2_skip(lzma_mf *, uint32_t)");
      }
      move_pending(mf);
    }
    else {
      puVar3 = mf->buffer;
      pos = mf->offset + uVar2;
      uVar1 = *(ushort *)(puVar3 + uVar2);
      cur_match = mf->hash[uVar1];
      mf->hash[uVar1] = pos;
      bt_skip_func(len_limit,pos,puVar3 + uVar2,cur_match,mf->depth,mf->son,mf->cyclic_pos,
                   mf->cyclic_size);
      move_pos(mf);
    }
    amount = amount - 1;
  } while (amount != 0);
  return;
}

Assistant:

extern void
lzma_mf_bt2_skip(lzma_mf *mf, uint32_t amount)
{
	do {
		const uint8_t *cur;
		uint32_t pos;
		uint32_t hash_value; /* hash_2_calc */
		uint32_t cur_match;

		header_skip(true, 2);

		hash_2_calc();

		cur_match = mf->hash[hash_value];
		mf->hash[hash_value] = pos;

		bt_skip();

	} while (--amount != 0);
}